

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExampleApp.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  
  uVar1 = projectone::Addition::twoValues(4,5);
  printf("Addition Result: %d\n",(ulong)uVar1);
  uVar1 = projectone::Addition::threeValues(4,5,5);
  printf("Addition Result: %d\n",(ulong)uVar1);
  uVar1 = Multiply::twoValues(4,5);
  printf("Multiply Result: %d\n",(ulong)uVar1);
  return 0;
}

Assistant:

int main() {
    int x = 4;
    int y = 5;
    int z = 5;

    int z1 = projectone::Addition::twoValues(x, y);
    printf("Addition Result: %d\n", z1);

    int z2 = projectone::Addition::threeValues(x, y, z);
    printf("Addition Result: %d\n", z2);

    int z3 = Multiply::twoValues(x, y);
    printf("Multiply Result: %d\n", z3);

    return 0;    
}